

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ArgMaxParameter::SharedCtor(ArgMaxParameter *this)

{
  ArgMaxParameter *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->out_max_val_,0,8);
  this->top_k_ = 1;
  return;
}

Assistant:

void ArgMaxParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&out_max_val_, 0, reinterpret_cast<char*>(&axis_) -
    reinterpret_cast<char*>(&out_max_val_) + sizeof(axis_));
  top_k_ = 1u;
}